

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fRasterizationTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles2::Functional::anon_unknown_1::LineInterpolationTest::iterate(LineInterpolationTest *this)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  float *pfVar3;
  ostringstream *poVar4;
  undefined8 uVar5;
  GLenum GVar6;
  TestLog *log;
  LineInterpolationTest *pLVar7;
  _Alloc_hider _Var8;
  size_type sVar9;
  LineInterpolationMethod LVar10;
  RenderTarget *pRVar11;
  ulong uVar12;
  int iVar13;
  int vtxNdx;
  long lVar14;
  int iVar15;
  int vtxNdx_1;
  ulong uVar16;
  long lVar17;
  bool bVar18;
  float fVar19;
  allocator<char> local_2a1;
  LineInterpolationTest *local_2a0;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> drawBuffer;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> colorBuffer;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  _Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
  local_238;
  ScopedLogSection section;
  Surface resultImage;
  RasterizationArguments local_1f0;
  string iterationDescription;
  SceneLine line;
  
  colorBuffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(colorBuffer.
                         super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,this->m_iteration + 1);
  local_2a0 = this;
  de::toString<int>((string *)&resultImage,(int *)&colorBuffer);
  std::operator+(&local_258,"Test iteration ",(string *)&resultImage);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&line,
                 &local_258," / ");
  de::toString<int>((string *)&drawBuffer,&local_2a0->m_iterationCount);
  std::operator+(&iterationDescription,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&line,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&drawBuffer);
  std::__cxx11::string::~string((string *)&drawBuffer);
  std::__cxx11::string::~string((string *)&line);
  std::__cxx11::string::~string((string *)&local_258);
  std::__cxx11::string::~string((string *)&resultImage);
  log = ((local_2a0->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx
        )->m_log;
  resultImage.m_width = local_2a0->m_iteration + 1;
  de::toString<int>(&local_258,&resultImage.m_width);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&line,
                 "Iteration",&local_258);
  tcu::ScopedLogSection::ScopedLogSection(&section,log,(string *)&line,&iterationDescription);
  std::__cxx11::string::~string((string *)&line);
  std::__cxx11::string::~string((string *)&local_258);
  pLVar7 = local_2a0;
  iVar15 = (local_2a0->super_BaseRenderingCase).m_renderSize;
  tcu::Surface::Surface(&resultImage,iVar15,iVar15);
  drawBuffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  colorBuffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  drawBuffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  drawBuffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_238._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  colorBuffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  colorBuffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_238._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_238._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  line.positions[0].m_data[0] = 1.0;
  line.positions[0].m_data[1] = 0.0;
  line.positions[0].m_data[2] = 0.0;
  line.positions[0].m_data[3] = 1.0;
  line.positions[1].m_data[0] = 0.0;
  line.positions[1].m_data[1] = 1.0;
  line.positions[1].m_data[2] = 0.0;
  line.positions[1].m_data[3] = 1.0;
  line.colors[0].m_data[0] = 0.0;
  line.colors[0].m_data[1] = 0.0;
  line.colors[0].m_data[2] = 1.0;
  line.colors[0].m_data[3] = 1.0;
  deRandom_init((deRandom *)&local_258,pLVar7->m_iteration * 1000 + pLVar7->m_primitive + 0x7b);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize(&drawBuffer,6)
  ;
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize
            (&colorBuffer,6);
  lVar14 = 0;
  for (uVar16 = 0;
      (long)uVar16 <
      (long)(int)((ulong)((long)drawBuffer.
                                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)drawBuffer.
                               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 4); uVar16 = uVar16 + 1
      ) {
    fVar19 = deRandom_getFloat((deRandom *)&local_258);
    *(float *)((long)(drawBuffer.
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar14) =
         fVar19 * 1.8 + -0.9;
    fVar19 = deRandom_getFloat((deRandom *)&local_258);
    *(float *)((long)(drawBuffer.
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar14 + 4) =
         fVar19 * 1.8 + -0.9;
    *(undefined4 *)
     ((long)(drawBuffer.
             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_start)->m_data + lVar14 + 8) = 0;
    fVar19 = 1.0;
    if (local_2a0->m_projective == true) {
      fVar19 = deRandom_getFloat((deRandom *)&local_258);
      fVar19 = fVar19 * 3.8 + 0.2;
      uVar5 = *(undefined8 *)
               ((long)(drawBuffer.
                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar14);
      *(ulong *)((long)(drawBuffer.
                        super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar14) =
           CONCAT44(fVar19 * (float)((ulong)uVar5 >> 0x20),fVar19 * (float)uVar5);
      *(float *)((long)(drawBuffer.
                        super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar14 + 8) =
           *(float *)((long)(drawBuffer.
                             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar14 + 8) *
           fVar19;
    }
    *(float *)((long)(drawBuffer.
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar14 + 0xc) = fVar19;
    puVar1 = (undefined8 *)((long)&line + lVar14 + (uVar16 / 3) * -0x30);
    uVar5 = puVar1[1];
    puVar2 = (undefined8 *)
             ((long)(colorBuffer.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar14);
    *puVar2 = *puVar1;
    puVar2[1] = uVar5;
    lVar14 = lVar14 + 0x10;
  }
  GVar6 = local_2a0->m_primitive;
  if (GVar6 == 1) {
    for (iVar15 = 1; iVar13 = iVar15 + -1,
        iVar13 < (int)((ulong)((long)drawBuffer.
                                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)drawBuffer.
                                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 4) + -1;
        iVar15 = iVar15 + 2) {
      tcu::LineSceneSpec::SceneLine::SceneLine(&line);
      line.positions[0].m_data._0_8_ =
           *(undefined8 *)
            drawBuffer.
            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
            _M_impl.super__Vector_impl_data._M_start[iVar13].m_data;
      line.positions[0].m_data._8_8_ =
           *(undefined8 *)
            (drawBuffer.
             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_start[iVar13].m_data + 2);
      line.positions[1].m_data._0_8_ =
           *(undefined8 *)
            drawBuffer.
            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
            _M_impl.super__Vector_impl_data._M_start[iVar15].m_data;
      line.positions[1].m_data._8_8_ =
           *(undefined8 *)
            (drawBuffer.
             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_start[iVar15].m_data + 2);
      line.colors[0].m_data._0_8_ =
           *(undefined8 *)
            colorBuffer.
            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
            _M_impl.super__Vector_impl_data._M_start[iVar13].m_data;
      line.colors[0].m_data._8_8_ =
           *(undefined8 *)
            (colorBuffer.
             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_start[iVar13].m_data + 2);
      line.colors[1].m_data._0_8_ =
           *(undefined8 *)
            colorBuffer.
            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
            _M_impl.super__Vector_impl_data._M_start[iVar15].m_data;
      line.colors[1].m_data._8_8_ =
           *(undefined8 *)
            (colorBuffer.
             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_start[iVar15].m_data + 2);
      std::vector<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>::
      push_back((vector<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                 *)&local_238,&line);
    }
  }
  else if (GVar6 == 3) {
    lVar14 = 0x10;
    for (lVar17 = 0;
        lVar17 < ((long)drawBuffer.
                        super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)drawBuffer.
                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                       ._M_impl.super__Vector_impl_data._M_start) * 0x10000000 + -0x100000000 >>
                 0x20; lVar17 = lVar17 + 1) {
      tcu::LineSceneSpec::SceneLine::SceneLine(&line);
      pfVar3 = (float *)((long)drawBuffer.
                               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[-1].m_data + lVar14);
      line.positions[0].m_data._0_8_ = *(undefined8 *)pfVar3;
      line.positions[0].m_data._8_8_ = *(undefined8 *)(pfVar3 + 2);
      pfVar3 = (float *)((long)(drawBuffer.
                                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar14);
      line.positions[1].m_data._0_8_ = *(undefined8 *)pfVar3;
      line.positions[1].m_data._8_8_ = *(undefined8 *)(pfVar3 + 2);
      pfVar3 = (float *)((long)colorBuffer.
                               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[-1].m_data + lVar14);
      line.colors[0].m_data._0_8_ = *(undefined8 *)pfVar3;
      line.colors[0].m_data._8_8_ = *(undefined8 *)(pfVar3 + 2);
      pfVar3 = (float *)((long)(colorBuffer.
                                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar14);
      line.colors[1].m_data._0_8_ = *(undefined8 *)pfVar3;
      line.colors[1].m_data._8_8_ = *(undefined8 *)(pfVar3 + 2);
      std::vector<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>::
      push_back((vector<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                 *)&local_238,&line);
      lVar14 = lVar14 + 0x10;
    }
  }
  else if (GVar6 == 2) {
    for (iVar15 = 1;
        iVar15 + -1 <
        (int)((ulong)((long)drawBuffer.
                            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)drawBuffer.
                           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 4); iVar15 = iVar15 + 1) {
      tcu::LineSceneSpec::SceneLine::SceneLine(&line);
      iVar13 = (int)((ulong)((long)drawBuffer.
                                   super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)drawBuffer.
                                  super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 4);
      uVar16 = (long)(iVar15 + -1) % (long)iVar13 & 0xffffffff;
      line.positions[0].m_data._0_8_ =
           *(undefined8 *)
            drawBuffer.
            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
            _M_impl.super__Vector_impl_data._M_start[uVar16].m_data;
      line.positions[0].m_data._8_8_ =
           *(undefined8 *)
            (drawBuffer.
             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_start[uVar16].m_data + 2);
      uVar12 = (long)iVar15 % (long)iVar13 & 0xffffffff;
      line.positions[1].m_data._0_8_ =
           *(undefined8 *)
            drawBuffer.
            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
            _M_impl.super__Vector_impl_data._M_start[uVar12].m_data;
      line.positions[1].m_data._8_8_ =
           *(undefined8 *)
            (drawBuffer.
             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_start[uVar12].m_data + 2);
      line.colors[0].m_data._0_8_ =
           *(undefined8 *)
            colorBuffer.
            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
            _M_impl.super__Vector_impl_data._M_start[uVar16].m_data;
      line.colors[0].m_data._8_8_ =
           *(undefined8 *)
            (colorBuffer.
             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_start[uVar16].m_data + 2);
      line.colors[1].m_data._0_8_ =
           *(undefined8 *)
            colorBuffer.
            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
            _M_impl.super__Vector_impl_data._M_start[uVar12].m_data;
      line.colors[1].m_data._8_8_ =
           *(undefined8 *)
            (colorBuffer.
             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_start[uVar12].m_data + 2);
      std::vector<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>::
      push_back((vector<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                 *)&local_238,&line);
    }
  }
  line.positions[0].m_data._0_8_ =
       ((local_2a0->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)
       ->m_log;
  poVar4 = (ostringstream *)(line.positions[0].m_data + 2);
  std::__cxx11::ostringstream::ostringstream(poVar4);
  std::operator<<((ostream *)poVar4,"Generated vertices:");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&line,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar4);
  poVar4 = (ostringstream *)(line.positions[0].m_data + 2);
  lVar14 = 0;
  for (lVar17 = 0;
      lVar17 < (int)((ulong)((long)drawBuffer.
                                   super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)drawBuffer.
                                  super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 4);
      lVar17 = lVar17 + 1) {
    line.positions[0].m_data._0_8_ =
         ((local_2a0->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.
         m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream(poVar4);
    std::operator<<((ostream *)poVar4,"\t");
    tcu::operator<<((ostream *)poVar4,
                    (Vector<float,_4> *)
                    ((long)(drawBuffer.
                            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar14));
    std::operator<<((ostream *)poVar4,",\tcolor= ");
    tcu::operator<<((ostream *)poVar4,
                    (Vector<float,_4> *)
                    ((long)(colorBuffer.
                            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar14));
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&line,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar4);
    lVar14 = lVar14 + 0x10;
  }
  BaseRenderingCase::drawPrimitives
            (&local_2a0->super_BaseRenderingCase,&resultImage,&drawBuffer,&colorBuffer,
             local_2a0->m_primitive);
  pLVar7 = local_2a0;
  local_258.field_2._M_allocated_capacity = 0;
  local_258._M_dataplus._M_p = (pointer)0x0;
  local_258._M_string_length = 0;
  local_1f0.numSamples = (local_2a0->super_BaseRenderingCase).m_numSamples;
  local_1f0.subpixelBits = (local_2a0->super_BaseRenderingCase).m_subpixelBits;
  pRVar11 = Context::getRenderTarget((local_2a0->super_BaseRenderingCase).super_TestCase.m_context);
  local_1f0.redBits = (pRVar11->m_pixelFormat).redBits;
  pRVar11 = Context::getRenderTarget((pLVar7->super_BaseRenderingCase).super_TestCase.m_context);
  local_1f0.greenBits = (pRVar11->m_pixelFormat).greenBits;
  pRVar11 = Context::getRenderTarget((pLVar7->super_BaseRenderingCase).super_TestCase.m_context);
  uVar5 = local_258.field_2._M_allocated_capacity;
  sVar9 = local_258._M_string_length;
  _Var8._M_p = local_258._M_dataplus._M_p;
  local_1f0.blueBits = (pRVar11->m_pixelFormat).blueBits;
  local_258.field_2._M_allocated_capacity =
       (size_type)local_238._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_258._M_dataplus._M_p = (pointer)local_238._M_impl.super__Vector_impl_data._M_start;
  local_258._M_string_length = (size_type)local_238._M_impl.super__Vector_impl_data._M_finish;
  local_238._M_impl.super__Vector_impl_data._M_start = (pointer)_Var8._M_p;
  local_238._M_impl.super__Vector_impl_data._M_finish = (pointer)sVar9;
  local_238._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)uVar5;
  local_258.field_2._8_4_ = (pLVar7->super_BaseRenderingCase).m_lineWidth;
  LVar10 = tcu::verifyLineGroupInterpolation
                     (&resultImage,(LineSceneSpec *)&local_258,&local_1f0,
                      ((pLVar7->super_BaseRenderingCase).super_TestCase.super_TestCase.
                       super_TestNode.m_testCtx)->m_log);
  if (LVar10 == LINEINTERPOLATION_STRICTLY_CORRECT) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&line,"Pass",&local_2a1);
    tcu::ResultCollector::addResult(&local_2a0->m_result,QP_TEST_RESULT_PASS,(string *)&line);
  }
  else if (LVar10 == LINEINTERPOLATION_PROJECTED) {
    line.positions[0].m_data._0_8_ =
         ((local_2a0->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.
         m_testCtx)->m_log;
    poVar4 = (ostringstream *)(line.positions[0].m_data + 2);
    std::__cxx11::ostringstream::ostringstream(poVar4);
    std::operator<<((ostream *)poVar4,
                    "Interpolation was calculated using coordinates projected onto major axis. This method does not produce the same values as the non-projecting method defined in the specification."
                   );
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&line,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar4);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&line,"Interpolation was calculated using projected coordinateds",
               &local_2a1);
    tcu::ResultCollector::addResult
              (&local_2a0->m_result,QP_TEST_RESULT_QUALITY_WARNING,(string *)&line);
  }
  else {
    if (LVar10 != LINEINTERPOLATION_INCORRECT) goto LAB_003759bf;
    if ((((float)local_258.field_2._8_4_ == 1.0) && (!NAN((float)local_258.field_2._8_4_))) ||
       ((local_2a0->super_BaseRenderingCase).m_numSamples < 2)) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&line,"Found invalid pixel values",&local_2a1);
      tcu::ResultCollector::addResult(&local_2a0->m_result,QP_TEST_RESULT_FAIL,(string *)&line);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&line,"Interpolation of multisampled wide lines failed",&local_2a1);
      tcu::ResultCollector::addResult
                (&local_2a0->m_result,QP_TEST_RESULT_COMPATIBILITY_WARNING,(string *)&line);
    }
  }
  std::__cxx11::string::~string((string *)&line);
LAB_003759bf:
  std::_Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>::
  ~_Vector_base((_Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                 *)&local_258);
  iVar15 = local_2a0->m_iteration + 1;
  local_2a0->m_iteration = iVar15;
  bVar18 = iVar15 != local_2a0->m_iterationCount;
  if (!bVar18) {
    tcu::ResultCollector::setTestContextResult
              (&local_2a0->m_result,
               (local_2a0->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.
               m_testCtx);
  }
  std::_Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>::
  ~_Vector_base(&local_238);
  std::_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~_Vector_base
            (&colorBuffer.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>);
  std::_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~_Vector_base
            (&drawBuffer.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>);
  tcu::Surface::~Surface(&resultImage);
  tcu::ScopedLogSection::~ScopedLogSection(&section);
  std::__cxx11::string::~string((string *)&iterationDescription);
  return (uint)bVar18;
}

Assistant:

LineInterpolationTest::IterateResult LineInterpolationTest::iterate (void)
{
	const std::string						iterationDescription	= "Test iteration " + de::toString(m_iteration+1) + " / " + de::toString(m_iterationCount);
	const tcu::ScopedLogSection				section					(m_testCtx.getLog(), "Iteration" + de::toString(m_iteration+1), iterationDescription);
	tcu::Surface							resultImage				(m_renderSize, m_renderSize);
	std::vector<tcu::Vec4>					drawBuffer;
	std::vector<tcu::Vec4>					colorBuffer;
	std::vector<LineSceneSpec::SceneLine>	lines;

	// generate scene
	generateVertices(m_iteration, drawBuffer, colorBuffer);
	extractLines(lines, drawBuffer, colorBuffer);

	// log
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Generated vertices:" << tcu::TestLog::EndMessage;
		for (int vtxNdx = 0; vtxNdx < (int)drawBuffer.size(); ++vtxNdx)
			m_testCtx.getLog() << tcu::TestLog::Message << "\t" << drawBuffer[vtxNdx] << ",\tcolor= " << colorBuffer[vtxNdx] << tcu::TestLog::EndMessage;
	}

	// draw image
	drawPrimitives(resultImage, drawBuffer, colorBuffer, m_primitive);

	// compare
	{
		RasterizationArguments	args;
		LineSceneSpec			scene;
		LineInterpolationMethod	iterationResult;

		args.numSamples		= m_numSamples;
		args.subpixelBits	= m_subpixelBits;
		args.redBits		= m_context.getRenderTarget().getPixelFormat().redBits;
		args.greenBits		= m_context.getRenderTarget().getPixelFormat().greenBits;
		args.blueBits		= m_context.getRenderTarget().getPixelFormat().blueBits;

		scene.lines.swap(lines);
		scene.lineWidth = m_lineWidth;

		iterationResult = verifyLineGroupInterpolation(resultImage, scene, args, m_testCtx.getLog());
		switch (iterationResult)
		{
			case tcu::LINEINTERPOLATION_STRICTLY_CORRECT:
				// line interpolation matches the specification
				m_result.addResult(QP_TEST_RESULT_PASS, "Pass");
				break;

			case tcu::LINEINTERPOLATION_PROJECTED:
				// line interpolation weights are otherwise correct, but they are projected onto major axis
				m_testCtx.getLog()	<< tcu::TestLog::Message
									<< "Interpolation was calculated using coordinates projected onto major axis. "
									   "This method does not produce the same values as the non-projecting method defined in the specification."
									<< tcu::TestLog::EndMessage;
				m_result.addResult(QP_TEST_RESULT_QUALITY_WARNING, "Interpolation was calculated using projected coordinateds");
				break;

			case tcu::LINEINTERPOLATION_INCORRECT:
				if (scene.lineWidth != 1.0f && m_numSamples > 1)
				{
					// multisampled wide lines might not be supported
					m_result.addResult(QP_TEST_RESULT_COMPATIBILITY_WARNING, "Interpolation of multisampled wide lines failed");
				}
				else
				{
					// line interpolation is incorrect
					m_result.addResult(QP_TEST_RESULT_FAIL, "Found invalid pixel values");
				}
				break;

			default:
				DE_ASSERT(false);
				break;
		}
	}

	// result
	if (++m_iteration == m_iterationCount)
	{
		m_result.setTestContextResult(m_testCtx);
		return STOP;
	}
	else
		return CONTINUE;
}